

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::StringMakerBase<true>::convert<std::atomic<int>>
          (String *__return_storage_ptr__,StringMakerBase<true> *this,atomic<int> *in)

{
  ostream *this_00;
  
  this_00 = getTlsOss(true);
  std::ostream::operator<<(this_00,*(int *)this);
  getTlsOssResult();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
            /* When parameter "in" is a null terminated const char* it works.
	     * When parameter "in" is a T arr[N] without '\0' we can fill the
             * stringstream with N objects (T=char).If in is char pointer *
             * without '\0' , it would cause segfault
	     * stepping over unaccessible memory.
             */

            filloss(in);
            return getTlsOssResult();
        }